

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void state_SINCOS(Context *ctx)

{
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  if ((ctx->dest_arg).writemask - 1U < 3) {
    uVar1 = ctx->source_args[0].swizzle;
    uVar2 = uVar1 & 3;
    if (((uVar2 == (uVar1 >> 2 & 3)) && (uVar2 == (uVar1 >> 4 & 3))) && (uVar2 == (uVar1 >> 6 & 3)))
    {
      if (((ctx->dest_arg).result_mod & 1) == 0) {
        if (ctx->major_ver < 3) {
          uVar3 = 1;
          if ((ctx->source_args[1].regtype != REG_TYPE_CONST) ||
             (uVar3 = 2, ctx->source_args[2].regtype != REG_TYPE_CONST)) {
            failf(ctx,"SINCOS src%d must be constfloat",uVar3);
            return;
          }
          if (ctx->source_args[1].regnum == ctx->source_args[2].regnum) {
            pcVar4 = "SINCOS src1 and src2 must be different registers";
            goto LAB_00118c48;
          }
        }
        return;
      }
      pcVar4 = "SINCOS destination can\'t use saturate modifier";
    }
    else {
      pcVar4 = "SINCOS src0 must have replicate swizzle";
    }
  }
  else {
    pcVar4 = "SINCOS write mask must be .x or .y or .xy";
  }
LAB_00118c48:
  failf(ctx,"%s",pcVar4);
  return;
}

Assistant:

static void state_SINCOS(Context *ctx)
{
    const DestArgInfo *dst = &ctx->dest_arg;
    const int mask = dst->writemask;
    if (!writemask_x(mask) && !writemask_y(mask) && !writemask_xy(mask))
        fail(ctx, "SINCOS write mask must be .x or .y or .xy");

    else if (!replicate_swizzle(ctx->source_args[0].swizzle))
        fail(ctx, "SINCOS src0 must have replicate swizzle");

    else if (dst->result_mod & MOD_SATURATE)  // according to msdn...
        fail(ctx, "SINCOS destination can't use saturate modifier");

    // this opcode needs extra registers, with extra limitations, for <= sm2.
    else if (!shader_version_atleast(ctx, 3, 0))
    {
        int i;
        for (i = 1; i < 3; i++)
        {
            if (ctx->source_args[i].regtype != REG_TYPE_CONST)
            {
                failf(ctx, "SINCOS src%d must be constfloat", i);
                return;
            } // if
        } // for

        if (ctx->source_args[1].regnum == ctx->source_args[2].regnum)
            fail(ctx, "SINCOS src1 and src2 must be different registers");
    } // if
}